

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

void __thiscall LowererMD::GenerateFastInlineBuiltInMathAbs(LowererMD *this,Instr *inlineInstr)

{
  code *pcVar1;
  bool bVar2;
  IRType IVar3;
  RegNum RVar4;
  Opnd *pOVar5;
  RegOpnd *regOpnd;
  undefined4 *puVar6;
  LabelInstr *instr;
  Instr *pIVar7;
  RegOpnd *pRVar8;
  RegOpnd *this_00;
  RegOpnd *tempRegOpnd_1;
  RegOpnd *tempRegOpnd;
  RegOpnd *regEDX;
  RegOpnd *regEAX;
  IRType srcType;
  Instr *continueInstr;
  Instr *nextInstr;
  Instr *tmpInstr;
  Opnd *dst;
  Opnd *src;
  Instr *inlineInstr_local;
  LowererMD *this_local;
  
  pOVar5 = IR::Instr::GetSrc1(inlineInstr);
  pOVar5 = IR::Opnd::Copy(pOVar5,this->m_func);
  regOpnd = (RegOpnd *)IR::Instr::UnlinkDst(inlineInstr);
  if (pOVar5 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x2121,"(src)","src");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  instr = IR::LabelInstr::New(Label,this->m_func,false);
  pIVar7 = Lowerer::LowerBailOnIntMin
                     (this->m_lowerer,inlineInstr,(BranchInstr *)0x0,(LabelInstr *)0x0);
  IR::Instr::InsertAfter(pIVar7,&instr->super_Instr);
  IVar3 = IR::Opnd::GetType(pOVar5);
  if (IVar3 == TyInt32) {
    pRVar8 = IR::RegOpnd::New(TyInt32,this->m_func);
    RVar4 = LowererMDArch::GetRegIMulDestLower();
    IR::RegOpnd::SetReg(pRVar8,RVar4);
    pIVar7 = IR::Instr::New(MOV,&pRVar8->super_Opnd,pOVar5,this->m_func);
    IR::Instr::InsertBefore(&instr->super_Instr,pIVar7);
    this_00 = IR::RegOpnd::New(TyInt32,this->m_func);
    RVar4 = LowererMDArch::GetRegIMulHighDestLower();
    IR::RegOpnd::SetReg(this_00,RVar4);
    pIVar7 = IR::Instr::New(CDQ,&this_00->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(&instr->super_Instr,pIVar7);
    pIVar7 = IR::Instr::New(XOR,&pRVar8->super_Opnd,&pRVar8->super_Opnd,&this_00->super_Opnd,
                            this->m_func);
    IR::Instr::InsertBefore(&instr->super_Instr,pIVar7);
    pIVar7 = IR::Instr::New(SUB,&pRVar8->super_Opnd,&pRVar8->super_Opnd,&this_00->super_Opnd,
                            this->m_func);
    IR::Instr::InsertBefore(&instr->super_Instr,pIVar7);
    pIVar7 = IR::Instr::New(MOV,(Opnd *)regOpnd,&pRVar8->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(&instr->super_Instr,pIVar7);
  }
  else if (IVar3 == TyFloat64) {
    bVar2 = IR::Opnd::IsRegOpnd((Opnd *)regOpnd);
    if (bVar2) {
      pIVar7 = IR::Instr::New(MOVSD,(Opnd *)regOpnd,pOVar5,this->m_func);
      IR::Instr::InsertBefore(&instr->super_Instr,pIVar7);
      GenerateFloatAbs(this,regOpnd,&instr->super_Instr);
    }
    else {
      pRVar8 = IR::RegOpnd::New((StackSym *)0x0,TyFloat64,this->m_func);
      pRVar8->field_0x18 = pRVar8->field_0x18 & 0xfd | 2;
      pIVar7 = IR::Instr::New(MOVSD,&pRVar8->super_Opnd,pOVar5,this->m_func);
      IR::Instr::InsertBefore(&instr->super_Instr,pIVar7);
      GenerateFloatAbs(this,pRVar8,&instr->super_Instr);
      pIVar7 = IR::Instr::New(MOVSD,(Opnd *)regOpnd,&pRVar8->super_Opnd,this->m_func);
      IR::Instr::InsertBefore(&instr->super_Instr,pIVar7);
    }
  }
  else if (IVar3 == TyFloat32) {
    bVar2 = IR::Opnd::IsRegOpnd((Opnd *)regOpnd);
    if (bVar2) {
      pIVar7 = IR::Instr::New(MOVSS,(Opnd *)regOpnd,pOVar5,this->m_func);
      IR::Instr::InsertBefore(&instr->super_Instr,pIVar7);
      GenerateFloatAbs(this,regOpnd,&instr->super_Instr);
    }
    else {
      pRVar8 = IR::RegOpnd::New((StackSym *)0x0,TyFloat32,this->m_func);
      pRVar8->field_0x18 = pRVar8->field_0x18 & 0xfd | 2;
      pIVar7 = IR::Instr::New(MOVSS,&pRVar8->super_Opnd,pOVar5,this->m_func);
      IR::Instr::InsertBefore(&instr->super_Instr,pIVar7);
      GenerateFloatAbs(this,pRVar8,&instr->super_Instr);
      pIVar7 = IR::Instr::New(MOVSS,(Opnd *)regOpnd,&pRVar8->super_Opnd,this->m_func);
      IR::Instr::InsertBefore(&instr->super_Instr,pIVar7);
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x2185,"(0)","GenerateFastInlineBuiltInMathAbs: unexpected type of the src!"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  return;
}

Assistant:

void LowererMD::GenerateFastInlineBuiltInMathAbs(IR::Instr* inlineInstr)
{
    IR::Opnd* src = inlineInstr->GetSrc1()->Copy(this->m_func);
    IR::Opnd* dst = inlineInstr->UnlinkDst();
    Assert(src);
    IR::Instr* tmpInstr;

    IR::Instr* nextInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func);
    IR::Instr* continueInstr = m_lowerer->LowerBailOnIntMin(inlineInstr);
    continueInstr->InsertAfter(nextInstr);

    IRType srcType = src->GetType();
    if (srcType == IRType::TyInt32)
    {
        // Note: if execution gets so far, we always get (untagged) int32 here.
        // Since -x = ~x + 1, abs(x) = x, abs(-x) = -x, sign-extend(x) = 0, sign_extend(-x) = -1, where 0 <= x.
        // Then: abs(x) = sign-extend(x) XOR x - sign-extend(x)

        // Expected input (otherwise bailout):
        // - src1 is (untagged) int, not equal to int_min (abs(int_min) would produce overflow, as there's no corresponding positive int).

        //      MOV EAX, src
        IR::RegOpnd *regEAX = IR::RegOpnd::New(TyInt32, this->m_func);
        regEAX->SetReg(LowererMDArch::GetRegIMulDestLower());

        tmpInstr = IR::Instr::New(Js::OpCode::MOV, regEAX, src, this->m_func);
        nextInstr->InsertBefore(tmpInstr);

        IR::RegOpnd *regEDX = IR::RegOpnd::New(TyInt32, this->m_func);
        regEDX->SetReg(LowererMDArch::GetRegIMulHighDestLower());

        //      CDQ (sign-extend EAX into EDX, producing 64bit EDX:EAX value)
        // Note: put EDX on dst to give of def to the EDX lifetime
        tmpInstr = IR::Instr::New(Js::OpCode::CDQ, regEDX, this->m_func);
        nextInstr->InsertBefore(tmpInstr);

        //      XOR EAX, EDX
        tmpInstr = IR::Instr::New(Js::OpCode::XOR, regEAX, regEAX, regEDX, this->m_func);
        nextInstr->InsertBefore(tmpInstr);

        //      SUB EAX, EDX
        tmpInstr = IR::Instr::New(Js::OpCode::SUB, regEAX, regEAX, regEDX, this->m_func);
        nextInstr->InsertBefore(tmpInstr);

        //      MOV dst, EAX
        tmpInstr = IR::Instr::New(Js::OpCode::MOV, dst, regEAX, this->m_func);
        nextInstr->InsertBefore(tmpInstr);
    }
    else if (srcType == IRType::TyFloat64)
    {
        if (!dst->IsRegOpnd())
        {
            // MOVSD tempRegOpnd, src
            IR::RegOpnd* tempRegOpnd = IR::RegOpnd::New(nullptr, TyMachDouble, this->m_func);
            tempRegOpnd->m_isCallArg = true; // This is to make sure that lifetime of opnd is virtually extended until next CALL instr.
            tmpInstr = IR::Instr::New(Js::OpCode::MOVSD, tempRegOpnd, src, this->m_func);
            nextInstr->InsertBefore(tmpInstr);

            // This saves the result in the same register.
            this->GenerateFloatAbs(static_cast<IR::RegOpnd*>(tempRegOpnd), nextInstr);

            // MOVSD dst, tempRegOpnd
            tmpInstr = IR::Instr::New(Js::OpCode::MOVSD, dst, tempRegOpnd, this->m_func);
            nextInstr->InsertBefore(tmpInstr);
        }
        else
        {
            // MOVSD dst, src
            tmpInstr = IR::Instr::New(Js::OpCode::MOVSD, dst, src, this->m_func);
            nextInstr->InsertBefore(tmpInstr);

            // This saves the result in the same register.
            this->GenerateFloatAbs(static_cast<IR::RegOpnd*>(dst), nextInstr);
        }
    }
    else if (srcType == IRType::TyFloat32)
    {
        if (!dst->IsRegOpnd())
        {
            // MOVSS tempRegOpnd, src
            IR::RegOpnd* tempRegOpnd = IR::RegOpnd::New(nullptr, TyFloat32, this->m_func);
            tempRegOpnd->m_isCallArg = true; // This is to make sure that lifetime of opnd is virtually extended until next CALL instr.
            tmpInstr = IR::Instr::New(Js::OpCode::MOVSS, tempRegOpnd, src, this->m_func);
            nextInstr->InsertBefore(tmpInstr);

            // This saves the result in the same register.
            this->GenerateFloatAbs(static_cast<IR::RegOpnd*>(tempRegOpnd), nextInstr);

            // MOVSS dst, tempRegOpnd
            tmpInstr = IR::Instr::New(Js::OpCode::MOVSS, dst, tempRegOpnd, this->m_func);
            nextInstr->InsertBefore(tmpInstr);
        }
        else
        {
            // MOVSS dst, src
            tmpInstr = IR::Instr::New(Js::OpCode::MOVSS, dst, src, this->m_func);
            nextInstr->InsertBefore(tmpInstr);

            // This saves the result in the same register.
            this->GenerateFloatAbs(static_cast<IR::RegOpnd*>(dst), nextInstr);
        }
    }
    else
    {
        AssertMsg(FALSE, "GenerateFastInlineBuiltInMathAbs: unexpected type of the src!");
    }
}